

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int decompress(archive_read *a,_7zip_conflict *zip,void *buff,size_t *outbytes,void *b,size_t *used)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  unsigned_long uVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  Bool BVar7;
  ssize_t sVar8;
  undefined8 uVar9;
  size_t sVar10;
  bool local_12a;
  uint8_t *local_118;
  ssize_t bytes_2;
  size_t l;
  uint64_t uStack_e8;
  int sym;
  uint64_t flush_bytes;
  size_t zret;
  ZSTD_outBuffer output;
  ZSTD_inBuffer input;
  size_t bytes_1;
  size_t remaining;
  ssize_t bytes;
  uint local_88;
  int i;
  int ret;
  int r;
  size_t bcj2_avail_out;
  uint8_t *bcj2_next_out;
  size_t t_avail_out;
  size_t t_avail_in;
  size_t o_avail_out;
  size_t o_avail_in;
  uint8_t *t_next_out;
  uint8_t *t_next_in;
  size_t *used_local;
  void *b_local;
  size_t *outbytes_local;
  void *buff_local;
  _7zip_conflict *zip_local;
  archive_read *a_local;
  
  local_88 = 0;
  puVar1 = (uint8_t *)*used;
  puVar2 = (uint8_t *)*outbytes;
  bcj2_next_out = puVar2;
  o_avail_in = (size_t)buff;
  if ((zip->codec != 0x21) && (zip->codec2 == 0x3030103)) {
    if ((puVar1 != (uint8_t *)0x0) && ((puVar2 < (uint8_t *)0x5 && (zip->odd_bcj_size != 0)))) {
      *used = 0;
      *outbytes = 0;
      return 0;
    }
    bytes._4_4_ = 0;
    o_avail_in = (size_t)buff;
    while (zip->odd_bcj_size != 0 && bcj2_next_out != (uint8_t *)0x0) {
      *(uchar *)o_avail_in = zip->odd_bcj[bytes._4_4_];
      bcj2_next_out = bcj2_next_out + -1;
      zip->odd_bcj_size = zip->odd_bcj_size - 1;
      bytes._4_4_ = bytes._4_4_ + 1;
      o_avail_in = o_avail_in + 1;
    }
    if ((puVar1 == (uint8_t *)0x0) || (bcj2_next_out == (uint8_t *)0x0)) {
      *used = 0;
      *outbytes = (long)puVar2 - (long)bcj2_next_out;
      local_88 = (uint)(puVar1 == (uint8_t *)0x0);
      return local_88;
    }
  }
  bcj2_avail_out = o_avail_in;
  _ret = bcj2_next_out;
  if (zip->codec2 == 0x303011b) {
    if (zip->tmp_stream_bytes_remaining != 0) {
      sVar10 = zip->tmp_stream_bytes_remaining;
      sVar8 = Bcj2_Decode(zip,(uint8_t *)o_avail_in,(size_t)bcj2_next_out);
      if (sVar8 < 0) {
        archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
        return -0x19;
      }
      zip->main_stream_bytes_remaining =
           zip->main_stream_bytes_remaining - (sVar10 - zip->tmp_stream_bytes_remaining);
      _ret = bcj2_next_out + -sVar8;
      if ((puVar1 == (uint8_t *)0x0) || (_ret == (uint8_t *)0x0)) {
        *used = 0;
        *outbytes = (long)puVar2 - (long)_ret;
        if ((puVar1 == (uint8_t *)0x0) && (zip->tmp_stream_bytes_remaining != 0)) {
          local_88 = 1;
        }
        return local_88;
      }
      bcj2_avail_out = sVar8 + o_avail_in;
    }
    o_avail_in = (size_t)zip->tmp_stream_buff;
    bcj2_next_out = (uint8_t *)zip->tmp_stream_buff_size;
  }
  uVar3 = zip->codec;
  if (uVar3 == 0) {
    local_118 = puVar1;
    if (bcj2_next_out < puVar1) {
      local_118 = bcj2_next_out;
    }
    memcpy((void *)o_avail_in,b,(size_t)local_118);
    t_avail_out = (long)puVar1 - (long)local_118;
    bcj2_next_out = bcj2_next_out + -(long)local_118;
    local_88 = (uint)(puVar1 == (uint8_t *)0x0);
  }
  else if ((uVar3 == 0x21) || (uVar3 == 0x30101)) {
    (zip->lzstream).next_in = (uint8_t *)b;
    (zip->lzstream).avail_in = (size_t)puVar1;
    (zip->lzstream).next_out = (uint8_t *)o_avail_in;
    (zip->lzstream).avail_out = (size_t)bcj2_next_out;
    uVar5 = lzma_code(&zip->lzstream,0);
    if (uVar5 != 0) {
      if (uVar5 != 1) {
        archive_set_error(&a->archive,-1,"Decompression failed(%d)",(ulong)uVar5);
        return -0x19;
      }
      lzma_end(&zip->lzstream);
      zip->lzstream_valid = 0;
      local_88 = 1;
    }
    t_avail_out = (zip->lzstream).avail_in;
    bcj2_next_out = (uint8_t *)(zip->lzstream).avail_out;
  }
  else if (uVar3 == 0x30401) {
    if (((zip->ppmd7_valid == 0) || (zip->ppmd7_stat < 0)) || (bcj2_next_out == (uint8_t *)0x0)) {
      archive_set_error(&a->archive,-1,"Decompression internal error");
      return -0x19;
    }
    (zip->ppstream).next_in = (uchar *)b;
    (zip->ppstream).avail_in = (int64_t)puVar1;
    (zip->ppstream).stream_in = 0;
    (zip->ppstream).next_out = (uchar *)o_avail_in;
    (zip->ppstream).avail_out = (int64_t)bcj2_next_out;
    if (zip->ppmd7_stat == 0) {
      (zip->bytein).a = a;
      (zip->bytein).Read = ppmd_read;
      (zip->range_dec).Stream = &zip->bytein;
      BVar7 = Ppmd7z_RangeDec_Init(&zip->range_dec);
      if (BVar7 == 0) {
        zip->ppmd7_stat = -1;
        archive_set_error(&a->archive,-1,"Failed to initialize PPMd range decoder");
        return -0x19;
      }
      if ((zip->ppstream).overconsumed != 0) {
        zip->ppmd7_stat = -1;
        return -0x19;
      }
      zip->ppmd7_stat = 1;
    }
    if (puVar1 == (uint8_t *)0x0) {
      uStack_e8 = zip->folder_outbytes_remaining;
    }
    else {
      uStack_e8 = 0;
    }
    do {
      iVar6 = Ppmd7_DecodeSymbol(&zip->ppmd7_context,&(zip->range_dec).p);
      if (iVar6 < 0) {
        zip->ppmd7_stat = -1;
        archive_set_error(&a->archive,0x54,"Failed to decode PPMd");
        return -0x19;
      }
      if ((zip->ppstream).overconsumed != 0) {
        zip->ppmd7_stat = -1;
        return -0x19;
      }
      puVar4 = (zip->ppstream).next_out;
      (zip->ppstream).next_out = puVar4 + 1;
      *puVar4 = (uchar)iVar6;
      (zip->ppstream).avail_out = (zip->ppstream).avail_out + -1;
      (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
      if (uStack_e8 != 0) {
        uStack_e8 = uStack_e8 - 1;
      }
      local_12a = false;
      if ((zip->ppstream).avail_out != 0) {
        local_12a = (zip->ppstream).avail_in != 0 || uStack_e8 != 0;
      }
    } while (local_12a);
    t_avail_out = (zip->ppstream).avail_in;
    bcj2_next_out = (uint8_t *)(zip->ppstream).avail_out;
  }
  else if (uVar3 == 0x40108) {
    (zip->stream).next_in = (Bytef *)b;
    t_avail_out._0_4_ = (uInt)puVar1;
    (zip->stream).avail_in = (uInt)t_avail_out;
    (zip->stream).next_out = (Bytef *)o_avail_in;
    (zip->stream).avail_out = (uInt)bcj2_next_out;
    uVar5 = inflate(&zip->stream,0);
    if (uVar5 != 0) {
      if (uVar5 != 1) {
        archive_set_error(&a->archive,-1,"File decompression failed (%d)",(ulong)uVar5);
        return -0x19;
      }
      local_88 = 1;
    }
    t_avail_out = (size_t)(zip->stream).avail_in;
    bcj2_next_out = (uint8_t *)(ulong)(zip->stream).avail_out;
  }
  else {
    if (uVar3 != 0x4f71101) {
      archive_set_error(&a->archive,-1,"Decompression internal error");
      return -0x19;
    }
    zret = o_avail_in;
    output.dst = bcj2_next_out;
    output.size = 0;
    output.pos = (size_t)b;
    uVar9 = ZSTD_decompressStream(zip->zstd_dstream,&zret,&output.pos);
    iVar6 = ZSTD_isError(uVar9);
    if (iVar6 != 0) {
      uVar9 = ZSTD_getErrorName(uVar9);
      archive_set_error(&a->archive,-1,"Zstd decompression failed: %s",uVar9);
      return -0x19;
    }
    bcj2_next_out = bcj2_next_out + -output.size;
    t_avail_out = (size_t)puVar1;
  }
  if ((local_88 == 0) || (local_88 == 1)) {
    *used = (long)puVar1 - t_avail_out;
    *outbytes = (long)puVar2 - (long)bcj2_next_out;
    if (zip->codec != 0x21) {
      if (zip->codec2 == 0x3030103) {
        sVar10 = x86_Convert(zip,(uint8_t *)buff,*outbytes);
        zip->odd_bcj_size = *outbytes - sVar10;
        if (((zip->odd_bcj_size == 0) || (4 < zip->odd_bcj_size)) ||
           ((puVar1 == (uint8_t *)0x0 || (local_88 == 1)))) {
          zip->odd_bcj_size = 0;
        }
        else {
          memcpy(zip->odd_bcj,(void *)((long)buff + sVar10),zip->odd_bcj_size);
          *outbytes = sVar10;
        }
      }
      else if (zip->codec2 == 0x3030501) {
        sVar10 = arm_Convert(zip,(uint8_t *)buff,*outbytes);
        *outbytes = sVar10;
      }
      else if (zip->codec2 == 10) {
        sVar10 = arm64_Convert(zip,(uint8_t *)buff,*outbytes);
        *outbytes = sVar10;
      }
      else if (zip->codec2 == 0x3030805) {
        sVar10 = sparc_Convert(zip,(uint8_t *)buff,*outbytes);
        *outbytes = sVar10;
      }
      else if (zip->codec2 == 0x3030205) {
        sVar10 = powerpc_Convert(zip,(uint8_t *)buff,*outbytes);
        *outbytes = sVar10;
      }
    }
    if (zip->codec2 == 0x303011b) {
      zip->tmp_stream_bytes_avail = zip->tmp_stream_buff_size - (long)bcj2_next_out;
      if (zip->main_stream_bytes_remaining < zip->tmp_stream_bytes_avail) {
        zip->tmp_stream_bytes_avail = zip->main_stream_bytes_remaining;
      }
      zip->tmp_stream_bytes_remaining = zip->tmp_stream_bytes_avail;
      sVar8 = Bcj2_Decode(zip,(uint8_t *)bcj2_avail_out,(size_t)_ret);
      if (sVar8 < 0) {
        archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
        return -0x19;
      }
      zip->main_stream_bytes_remaining =
           zip->main_stream_bytes_remaining -
           (zip->tmp_stream_bytes_avail - zip->tmp_stream_bytes_remaining);
      *outbytes = (long)puVar2 - ((long)_ret - sVar8);
    }
  }
  return local_88;
}

Assistant:

static int
decompress(struct archive_read *a, const void **buff, size_t *outbytes,
    const void *b, size_t *used)
{
	struct xar *xar;
	void *outbuff;
	size_t avail_in, avail_out;
	int r;

	xar = (struct xar *)(a->format->data);
	avail_in = *used;
	outbuff = (void *)(uintptr_t)*buff;
	if (outbuff == NULL) {
		if (xar->outbuff == NULL) {
			xar->outbuff = malloc(OUTBUFF_SIZE);
			if (xar->outbuff == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Couldn't allocate memory for out buffer");
				return (ARCHIVE_FATAL);
			}
		}
		outbuff = xar->outbuff;
		*buff = outbuff;
		avail_out = OUTBUFF_SIZE;
	} else
		avail_out = *outbytes;
	switch (xar->rd_encoding) {
	case GZIP:
		xar->stream.next_in = (Bytef *)(uintptr_t)b;
		xar->stream.avail_in = (uInt)avail_in;
		xar->stream.next_out = (unsigned char *)outbuff;
		xar->stream.avail_out = (uInt)avail_out;
		r = inflate(&(xar->stream), 0);
		switch (r) {
		case Z_OK: /* Decompressor made some progress.*/
		case Z_STREAM_END: /* Found end of stream. */
			break;
		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "File decompression failed (%d)", r);
			return (ARCHIVE_FATAL);
		}
		*used = avail_in - xar->stream.avail_in;
		*outbytes = avail_out - xar->stream.avail_out;
		break;
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	case BZIP2:
		xar->bzstream.next_in = (char *)(uintptr_t)b;
		xar->bzstream.avail_in = (unsigned int)avail_in;
		xar->bzstream.next_out = (char *)outbuff;
		xar->bzstream.avail_out = (unsigned int)avail_out;
		r = BZ2_bzDecompress(&(xar->bzstream));
		switch (r) {
		case BZ_STREAM_END: /* Found end of stream. */
			switch (BZ2_bzDecompressEnd(&(xar->bzstream))) {
			case BZ_OK:
				break;
			default:
				archive_set_error(&(a->archive),
				    ARCHIVE_ERRNO_MISC,
				    "Failed to clean up decompressor");
				return (ARCHIVE_FATAL);
			}
			xar->bzstream_valid = 0;
			/* FALLTHROUGH */
		case BZ_OK: /* Decompressor made some progress. */
			break;
		default:
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "bzip decompression failed");
			return (ARCHIVE_FATAL);
		}
		*used = avail_in - xar->bzstream.avail_in;
		*outbytes = avail_out - xar->bzstream.avail_out;
		break;
#endif
#if defined(HAVE_LZMA_H) && defined(HAVE_LIBLZMA)
	case LZMA:
	case XZ:
		xar->lzstream.next_in = b;
		xar->lzstream.avail_in = avail_in;
		xar->lzstream.next_out = (unsigned char *)outbuff;
		xar->lzstream.avail_out = avail_out;
		r = lzma_code(&(xar->lzstream), LZMA_RUN);
		switch (r) {
		case LZMA_STREAM_END: /* Found end of stream. */
			lzma_end(&(xar->lzstream));
			xar->lzstream_valid = 0;
			/* FALLTHROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			break;
		default:
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "%s decompression failed(%d)",
			    (xar->entry_encoding == XZ)?"xz":"lzma",
			    r);
			return (ARCHIVE_FATAL);
		}
		*used = avail_in - xar->lzstream.avail_in;
		*outbytes = avail_out - xar->lzstream.avail_out;
		break;
#endif
#if !defined(HAVE_BZLIB_H) || !defined(BZ_CONFIG_ERROR)
	case BZIP2:
#endif
#if !defined(HAVE_LZMA_H) || !defined(HAVE_LIBLZMA)
	case LZMA:
	case XZ:
#endif
	case NONE:
	default:
		if (outbuff == xar->outbuff) {
			*buff = b;
			*used = avail_in;
			*outbytes = avail_in;
		} else {
			if (avail_out > avail_in)
				avail_out = avail_in;
			memcpy(outbuff, b, avail_out);
			*used = avail_out;
			*outbytes = avail_out;
		}
		break;
	}
	return (ARCHIVE_OK);
}